

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

int traverseephemeron(global_State *g,Table *h,int inv)

{
  Node *pNVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  GCObject *o;
  ulong uVar7;
  uint uVar8;
  byte bVar9;
  int local_3c;
  
  uVar7 = 1L << (h->lsizenode & 0x3f);
  local_3c = traversearray(g,h);
  uVar8 = (uint)uVar7;
  uVar6 = 0;
  bVar3 = false;
  bVar2 = false;
  do {
    uVar8 = uVar8 - 1;
    uVar5 = (ulong)uVar8;
    if (inv == 0) {
      uVar5 = uVar6;
    }
    pNVar1 = h->node + uVar5;
    bVar9 = (pNVar1->u).key_tt & 0x40;
    if (((pNVar1->u).tt_ & 0xf) == 0) {
      if (bVar9 != 0) {
        (pNVar1->u).key_tt = '\v';
      }
    }
    else {
      if (bVar9 == 0) {
        o = (GCObject *)0x0;
      }
      else {
        o = (pNVar1->u).key_val.gc;
      }
      iVar4 = iscleared(g,o);
      if (iVar4 == 0) {
        if ((((pNVar1->u).tt_ & 0x40) != 0) && (((*(GCObject **)pNVar1)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pNVar1);
          local_3c = 1;
        }
      }
      else {
        bVar3 = true;
        if ((((pNVar1->u).tt_ & 0x40) != 0) &&
           (bVar3 = true, (((pNVar1->u).value_.gc)->marked & 0x18) != 0)) {
          bVar2 = true;
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while (uVar7 != uVar6);
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar2) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else {
    if (!bVar3) {
      genlink(g,(GCObject *)h);
      return local_3c;
    }
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  h->marked = h->marked & 199;
  return local_3c;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int nsize = sizenode(h);
  int marked = traversearray(g, h);  /* traverse array part */
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}